

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Parameters *
vkt::api::anon_unknown_1::DescriptorSetLayout::Parameters::single
          (Parameters *__return_storage_ptr__,deUint32 binding,VkDescriptorType descriptorType,
          deUint32 descriptorCount,VkShaderStageFlags stageFlags,bool useImmutableSampler)

{
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  bindings;
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  local_38;
  value_type local_1c;
  
  local_38.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c.binding = 0;
  local_1c.descriptorCount = 1;
  local_1c.useImmutableSampler = SUB41(descriptorCount,0);
  local_1c.descriptorType = binding;
  local_1c.stageFlags = descriptorType;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::push_back(&local_38,&local_1c);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::vector(&__return_storage_ptr__->bindings,&local_38);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static Parameters single (deUint32				binding,
								  VkDescriptorType		descriptorType,
								  deUint32				descriptorCount,
								  VkShaderStageFlags	stageFlags,
								  bool					useImmutableSampler = false)
		{
			vector<Binding> bindings;
			bindings.push_back(Binding(binding, descriptorType, descriptorCount, stageFlags, useImmutableSampler));
			return Parameters(bindings);
		}